

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNSResolver.cpp
# Opt level: O3

void __thiscall DNSResolver::reciveAndParse(DNSResolver *this)

{
  ushort uVar1;
  bool bVar2;
  ssize_t sVar3;
  size_t sVar4;
  uchar *puVar5;
  DNSResolver *__dest;
  int *piVar6;
  long *plVar7;
  bool bVar8;
  DNSResolver *this_00;
  void **ppvVar9;
  uchar *puVar10;
  ulong uVar11;
  int stop;
  RES_RECORD answers [20];
  int local_224;
  DNSResolver *local_220;
  void *local_218 [2];
  long *local_208;
  void *local_200 [2];
  long *local_1f0;
  
  sVar3 = recv(this->sockfd,this,0x10000,0);
  if (sVar3 < 1) {
    piVar6 = __errno_location();
    if (*piVar6 != 0xb) {
      this->drop = true;
    }
  }
  else {
    this->responseRecived = true;
    this_00 = (DNSResolver *)this->qname;
    sVar4 = strlen((char *)this_00);
    puVar10 = this->buf + sVar4 + 0x11;
    local_224 = 0;
    ppvVar9 = local_218;
    bVar2 = true;
    local_220 = this;
    do {
      bVar8 = bVar2;
      puVar5 = ReadName(this_00,puVar10,this->buf,&local_224);
      *ppvVar9 = puVar5;
      ppvVar9[1] = puVar10 + local_224;
      puVar5 = puVar10 + local_224 + 10;
      if (*(short *)(puVar10 + local_224) == 0x100) {
        uVar1 = *(ushort *)(puVar10 + local_224 + 8);
        uVar11 = (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
        this_00 = (DNSResolver *)(uVar11 + 1);
        __dest = (DNSResolver *)malloc((size_t)this_00);
        ppvVar9[2] = __dest;
        if (uVar1 != 0) {
          this_00 = __dest;
          memcpy(__dest,puVar5,uVar11 + (uVar11 == 0));
        }
        __dest->buf[uVar11] = '\0';
        this = local_220;
      }
      else {
        puVar10 = ReadName(this_00,puVar5,this->buf,&local_224);
        ppvVar9[2] = puVar10;
        uVar11 = (ulong)local_224;
      }
      ppvVar9 = local_200;
      puVar10 = puVar5 + uVar11;
      bVar2 = false;
    } while (bVar8);
    uVar1 = this->dns->ans_count;
    plVar7 = local_1f0;
    if ((1 < (ushort)(uVar1 << 8 | uVar1 >> 8)) || (plVar7 = local_208, uVar1 != 0)) {
      this->s_addr = *plVar7;
    }
    free(local_208);
    free(local_218[0]);
    free(local_1f0);
    free(local_200[0]);
  }
  return;
}

Assistant:

void DNSResolver::reciveAndParse() {
    if (::recv(sockfd, (char *) buf, 65536, 0) <= 0) {
        if (errno != EWOULDBLOCK) {
            drop = true;
        }
        return;
    }
    responseRecived = true;

    struct RES_RECORD answers[20];
    unsigned char *reader = &buf[sizeof(struct DNS_HEADER) + (strlen((const char *) qname) + 1) +
                                 sizeof(struct QUESTION)];

    //Start reading answers
    int stop = 0;
    for (int i = 0; i < 2; i++) {
        answers[i].name = ReadName(reader, buf, &stop);
        reader = reader + stop;

        answers[i].resource = (struct R_DATA *) (reader);
        reader = reader + sizeof(struct R_DATA);

        if (ntohs(answers[i].resource->type) == 1) //if its an ipv4 address
        {
            answers[i].rdata = (unsigned char *) malloc(ntohs(answers[i].resource->data_len) + 1);

            for (int j = 0; j < ntohs(answers[i].resource->data_len); j++) {
                answers[i].rdata[j] = reader[j];
            }

            answers[i].rdata[ntohs(answers[i].resource->data_len)] = '\0';

            reader = reader + ntohs(answers[i].resource->data_len);
        } else {
            answers[i].rdata = ReadName(reader, buf, &stop);
            reader = reader + stop;
        }
    }
    if (ntohs(dns->ans_count) > 1)
        s_addr = *((long *) answers[1].rdata);
    else if (ntohs(dns->ans_count) > 0)
        s_addr = *((long *) answers[0].rdata);
    for (int i = 0; i < 2; i++) {
               free(answers[i].rdata);
               free(answers[i].name);
    }
}